

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_int>_>::~ArrayBuilder
          (ArrayBuilder<kj::Promise<unsigned_int>_> *this)

{
  Promise<unsigned_int> *pPVar1;
  RemoveConst<kj::Promise<unsigned_int>_> *pRVar2;
  Promise<unsigned_int> *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Promise<unsigned_int> *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->ptr = (Promise<unsigned_int> *)0x0;
    this->pos = (RemoveConst<kj::Promise<unsigned_int>_> *)0x0;
    this->endPtr = (Promise<unsigned_int> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,8,(long)pRVar2 - (long)pPVar1 >> 3,
               (long)pPVar3 - (long)pPVar1 >> 3,
               ArrayDisposer::Dispose_<kj::Promise<unsigned_int>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }